

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::CatchScopeWalker::Get(CatchScopeWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  Type *pTVar6;
  PropertyRecord *pPVar7;
  undefined4 extraout_var_00;
  RecyclableObjectDisplay *this_00;
  RecyclableObject *this_01;
  DiagStackFrame *pDVar8;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  Type TVar9;
  Var aValue;
  undefined1 auStack_48 [8];
  DebuggerScopeProperty scopeProperty;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6b4,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) goto LAB_007ea4e3;
    *puVar5 = 0;
  }
  pDVar8 = this->pFrame;
  if (pDVar8 == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6b6,"(pFrame)","pFrame");
    if (!bVar2) goto LAB_007ea4e3;
    *puVar5 = 0;
    pDVar8 = this->pFrame;
  }
  iVar3 = (*pDVar8->_vptr_DiagStackFrame[10])();
  pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  this_02 = (this->debuggerScope->scopeProperties).ptr;
  if ((this_02->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
      count <= i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6b8,"(i < (int)GetChildrenCount())","i < (int)GetChildrenCount()"
                               );
    if (!bVar2) goto LAB_007ea4e3;
    *puVar5 = 0;
    this_02 = (this->debuggerScope->scopeProperties).ptr;
  }
  pTVar6 = JsUtil::
           List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this_02,i);
  auStack_48._0_4_ = pTVar6->propId;
  auStack_48._4_4_ = pTVar6->location;
  scopeProperty.propId = pTVar6->byteCodeInitializationOffset;
  scopeProperty.location = pTVar6->flags;
  pResolvedObject->propId = auStack_48._0_4_;
  pPVar7 = ScriptContext::GetPropertyName(pResolvedObject->scriptContext,auStack_48._0_4_);
  pResolvedObject->name = (LPCWSTR)(pPVar7 + 1);
  FetchValueAndAddress
            (this,(DebuggerScopeProperty *)auStack_48,&pResolvedObject->obj,
             &pResolvedObject->address);
  aValue = pResolvedObject->obj;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x6c4,"(pResolvedObject->obj)","pResolvedObject->obj");
    if (!bVar2) goto LAB_007ea4e3;
    *puVar5 = 0;
    aValue = pResolvedObject->obj;
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007ea4e3;
      *puVar5 = 0;
      aValue = (Var)0x0;
    }
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TVar9 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TVar9 = TypeIds_Number;
      goto LAB_007ea3cc;
    }
    this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007ea4e3;
      *puVar5 = 0;
    }
    TVar9 = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(this_01), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_007ea4e3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_007ea3cc:
  pResolvedObject->typeId = TVar9;
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  this_00 = (RecyclableObjectDisplay *)
            new<Memory::ArenaAllocator>
                      (0x38,(ArenaAllocator *)CONCAT44(extraout_var_00,iVar3),0x35916e);
  RecyclableObjectDisplay::RecyclableObjectDisplay(this_00,pResolvedObject,0);
  pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)this_00;
  return 1;
}

Assistant:

BOOL CatchScopeWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);

        Assert(pFrame);
        pResolvedObject->scriptContext = pFrame->GetScriptContext();
        Assert(i < (int)GetChildrenCount());
        Js::DebuggerScopeProperty scopeProperty = debuggerScope->scopeProperties->Item(i);

        pResolvedObject->propId = scopeProperty.propId;

        const Js::PropertyRecord* propertyRecord = pResolvedObject->scriptContext->GetPropertyName(pResolvedObject->propId);

        // TODO: If this is a symbol-keyed property, we should indicate that in the name - "Symbol (description)"
        pResolvedObject->name = propertyRecord->GetBuffer();

        FetchValueAndAddress(scopeProperty, &pResolvedObject->obj, &pResolvedObject->address);

        Assert(pResolvedObject->obj);

        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay =  Anew(pFrame->GetArena(), RecyclableObjectDisplay, pResolvedObject);

        return TRUE;
    }